

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

char * httplib::detail::find_content_type
                 (string *path,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *user_data)

{
  bool bVar1;
  uint uVar2;
  _Self local_60 [3];
  _Self local_48;
  const_iterator it;
  string ext;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *user_data_local;
  string *path_local;
  
  file_extension((string *)&it,path);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(user_data,(string *)&it);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(user_data);
  bVar1 = std::operator!=(&local_48,local_60);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_48);
    path_local = (string *)std::__cxx11::string::c_str();
    goto LAB_001aa8b1;
  }
  uVar2 = str2tag((string *)&it);
  if (uVar2 == 0x76d) {
    path_local = (string *)anon_var_dwarf_7b93d;
    goto LAB_001aa8b1;
  }
  if (uVar2 == 0xd3d) {
    path_local = (string *)anon_var_dwarf_7b9a5;
    goto LAB_001aa8b1;
  }
  if (uVar2 != 0xdd9) {
    if (uVar2 == 0x1a2c3) {
      path_local = (string *)anon_var_dwarf_7b7eb;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1a2c6) {
      path_local = (string *)anon_var_dwarf_7b7f8;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1a6df) {
      path_local = (string *)anon_var_dwarf_7b846;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1b0f1) {
LAB_001aa55e:
      path_local = (string *)anon_var_dwarf_7b805;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1b288) {
      path_local = (string *)anon_var_dwarf_7b853;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1c97d) {
LAB_001aa6a0:
      path_local = (string *)anon_var_dwarf_7b8a1;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1cb45) {
      path_local = (string *)anon_var_dwarf_7b887;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1d0f2) {
      path_local = (string *)anon_var_dwarf_7b957;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1d1b9) {
      path_local = (string *)anon_var_dwarf_7b860;
      goto LAB_001aa8b1;
    }
    if (uVar2 == 0x1d5fd) {
      path_local = (string *)anon_var_dwarf_7b909;
      goto LAB_001aa8b1;
    }
    if (uVar2 != 0x1db34) {
      if (uVar2 == 0x1de29) {
        path_local = (string *)anon_var_dwarf_7b8ae;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1de2e) {
        path_local = (string *)anon_var_dwarf_7b8d5;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1dee6) {
        path_local = (string *)anon_var_dwarf_7b916;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1e078) {
        path_local = (string *)anon_var_dwarf_71de3;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1e147) {
        path_local = (string *)anon_var_dwarf_7b971;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1e25b) {
        path_local = (string *)anon_var_dwarf_7b894;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1e322) {
        path_local = (string *)anon_var_dwarf_7b86d;
        goto LAB_001aa8b1;
      }
      if (uVar2 == 0x1e692) {
        path_local = (string *)anon_var_dwarf_7b964;
        goto LAB_001aa8b1;
      }
      if (uVar2 != 0x1f164) {
        if (uVar2 == 0x1f1d9) {
          path_local = (string *)anon_var_dwarf_7b998;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x1f580) {
          path_local = (string *)anon_var_dwarf_7b8fc;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x1f7f6) {
          path_local = (string *)anon_var_dwarf_7b81f;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x20a43) {
          path_local = (string *)anon_var_dwarf_7b9b2;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x371b38) {
          path_local = (string *)anon_var_dwarf_7b82c;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x372318) {
          path_local = (string *)anon_var_dwarf_7b839;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x372b57) {
          path_local = (string *)anon_var_dwarf_7b94a;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x37cf7d) goto LAB_001aa55e;
        if (uVar2 == 0x3adb38) {
          path_local = (string *)anon_var_dwarf_71c6c;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x3af938) goto LAB_001aa6a0;
        if (uVar2 == 0x3dad1f) {
          path_local = (string *)anon_var_dwarf_7b8bb;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x3daddb) {
          path_local = (string *)anon_var_dwarf_7b8e2;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x3e2ddd) {
          path_local = (string *)anon_var_dwarf_7b894;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x3ff093) {
          path_local = (string *)anon_var_dwarf_7b98b;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x409760) {
          path_local = (string *)anon_var_dwarf_7b87a;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x409771) {
          path_local = (string *)anon_var_dwarf_7b8ef;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x40977d) {
          path_local = (string *)anon_var_dwarf_7b8c8;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x40a648) {
          path_local = (string *)anon_var_dwarf_7b9bf;
          goto LAB_001aa8b1;
        }
        if (uVar2 == 0x40c278) {
          path_local = (string *)anon_var_dwarf_7b923;
          goto LAB_001aa8b1;
        }
        if (uVar2 != 0x843cec5) {
          if (uVar2 == 0x859114a) {
            path_local = (string *)anon_var_dwarf_7b930;
          }
          else {
            path_local = (string *)0x0;
          }
          goto LAB_001aa8b1;
        }
      }
      path_local = (string *)anon_var_dwarf_7b97e;
      goto LAB_001aa8b1;
    }
  }
  path_local = (string *)anon_var_dwarf_7b812;
LAB_001aa8b1:
  std::__cxx11::string::~string((string *)&it);
  return (char *)path_local;
}

Assistant:

inline const char *
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return nullptr;
  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}